

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMSymbolInfo.cpp
# Opt level: O3

int __thiscall ZXing::DataMatrix::SymbolInfo::horizontalDataRegions(SymbolInfo *this)

{
  int iVar1;
  out_of_range *this_00;
  
  iVar1 = this->_dataRegions;
  if (iVar1 < 0x10) {
    if (1 < iVar1 - 1U) {
      if (iVar1 != 4) {
LAB_001587cc:
        this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this_00,"Cannot handle this number of data regions");
        __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      iVar1 = 2;
    }
  }
  else if (iVar1 == 0x10) {
    iVar1 = 4;
  }
  else {
    if (iVar1 != 0x24) goto LAB_001587cc;
    iVar1 = 6;
  }
  return iVar1;
}

Assistant:

int
SymbolInfo::horizontalDataRegions() const
{
	switch (_dataRegions) {
	case 1:  return 1;
	case 2:  return 2;
	case 4:  return 2;
	case 16: return 4;
	case 36: return 6;
	default: throw std::out_of_range("Cannot handle this number of data regions");
	}
}